

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damageind.cpp
# Opt level: O2

void __thiscall CDamageInd::OnRender(CDamageInd *this)

{
  float fVar1;
  vec2 vVar2;
  int iVar3;
  IGraphics *pIVar4;
  int iVar5;
  CItem *pCVar6;
  int i;
  ulong uVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])
            (pIVar4,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar1 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
  if (OnRender()::s_LastLocalTime == '\0') {
    iVar5 = __cxa_guard_acquire(&OnRender()::s_LastLocalTime);
    if (iVar5 != 0) {
      OnRender::s_LastLocalTime = fVar1;
      __cxa_guard_release(&OnRender()::s_LastLocalTime);
    }
  }
  uVar7 = 0;
  do {
    iVar5 = (int)uVar7;
    pCVar6 = this->m_aItems + uVar7;
    while( true ) {
      if (this->m_NumItems <= iVar5) {
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x18])();
        OnRender::s_LastLocalTime = fVar1;
        return;
      }
      fVar8 = fVar1 - OnRender::s_LastLocalTime;
      fVar9 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
      fVar8 = pCVar6->m_LifeTime - fVar9 * fVar8;
      pCVar6->m_LifeTime = fVar8;
      if (0.0 <= fVar8) break;
      iVar3 = this->m_NumItems;
      this->m_NumItems = iVar3 + -1;
      if (iVar3 + -1 != iVar5) {
        fVar8 = this->m_aItems[(long)iVar3 + -1].m_StartAngle;
        pCVar6->m_LifeTime = this->m_aItems[(long)iVar3 + -1].m_LifeTime;
        pCVar6->m_StartAngle = fVar8;
        vVar2 = this->m_aItems[(long)iVar3 + -1].m_Dir;
        pCVar6->m_Pos = this->m_aItems[(long)iVar3 + -1].m_Pos;
        pCVar6->m_Dir = vVar2;
      }
    }
    fVar11 = (pCVar6->m_Dir).field_0.x * 75.0 + (pCVar6->m_Pos).field_0.x;
    fVar12 = (pCVar6->m_Dir).field_1.y * 75.0 + (pCVar6->m_Pos).field_1.y;
    vVar2 = pCVar6->m_Pos;
    fVar13 = (fVar8 + -0.6) / 0.15;
    fVar9 = 1.0;
    if (fVar13 <= 1.0) {
      fVar9 = fVar13;
    }
    fVar9 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar9);
    fVar8 = fVar8 * 10.0;
    fVar13 = 1.0;
    if (fVar8 <= 1.0) {
      fVar13 = fVar8;
    }
    uVar10 = ~-(uint)(fVar8 < 0.0) & (uint)fVar13;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (uVar10,uVar10,uVar10,uVar10);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
              (pCVar6->m_LifeTime + pCVar6->m_LifeTime + pCVar6->m_StartAngle);
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xe,0,0,0);
    CRenderTools::DrawSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (vVar2.field_0.x - fVar11) * fVar9 + fVar11,
               (vVar2.field_1.y - fVar12) * fVar9 + fVar12,48.0);
    uVar7 = (ulong)(iVar5 + 1);
  } while( true );
}

Assistant:

void CDamageInd::OnRender()
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	const float Now = Client()->LocalTime();
	static float s_LastLocalTime = Now;
	for(int i = 0; i < m_NumItems;)
	{
		m_aItems[i].m_LifeTime -= (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		if(m_aItems[i].m_LifeTime < 0.0f)
			DestroyItem(&m_aItems[i]);
		else
		{
			vec2 Pos = mix(m_aItems[i].m_Pos+m_aItems[i].m_Dir*75.0f, m_aItems[i].m_Pos, clamp((m_aItems[i].m_LifeTime-0.60f)/0.15f, 0.0f, 1.0f));
			const float Alpha = clamp(m_aItems[i].m_LifeTime * 10.0f, 0.0f, 1.0f); // 0.1 -> 0.0 == 1.0 -> 0.0
			Graphics()->SetColor(1.0f*Alpha, 1.0f*Alpha, 1.0f*Alpha, Alpha);
			Graphics()->QuadsSetRotation(m_aItems[i].m_StartAngle + m_aItems[i].m_LifeTime * 2.0f);
			RenderTools()->SelectSprite(SPRITE_STAR1);
			RenderTools()->DrawSprite(Pos.x, Pos.y, 48.0f);
			i++;
		}
	}
	Graphics()->QuadsEnd();
	s_LastLocalTime = Now;
}